

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int wb_write_to_temp(archive_write *a,void *buff,size_t s)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((s < 0x4001) || (*(long *)((long)a->format_data + 0x102e0) != 0x10000)) goto LAB_00597afa;
  uVar5 = (ulong)((uint)s & 0x7ff);
  uVar6 = s & 0xfffffffffffff800;
  plVar1 = (long *)((long)a->format_data + 0x102f0);
  *plVar1 = *plVar1 + uVar6;
  iVar3 = write_to_temp(a,buff,uVar6);
  iVar4 = 0;
  if (iVar3 == 0) {
    if (uVar5 == 0) goto LAB_00597ae3;
    buff = (void *)((long)buff + uVar6);
    bVar2 = true;
  }
  else {
    iVar4 = -0x1e;
LAB_00597ae3:
    bVar2 = false;
  }
  s = uVar5;
  if (!bVar2) {
    return iVar4;
  }
LAB_00597afa:
  do {
    if (s == 0) {
      return 0;
    }
    uVar5 = *(ulong *)((long)a->format_data + 0x102e0);
    uVar6 = s;
    if (uVar5 <= s) {
      uVar6 = uVar5;
    }
    memcpy((void *)((long)a->format_data + (0x102dc - uVar5)),buff,uVar6);
    iVar3 = wb_consume(a,uVar6);
    if (iVar3 != 0) {
      uVar6 = 0;
    }
    buff = (void *)((long)buff + uVar6);
    s = s - uVar6;
  } while (iVar3 == 0);
  return -0x1e;
}

Assistant:

static int
wb_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	const char *xp = buff;
	size_t xs = s;

	/*
	 * If a written data size is big enough to use system-call
	 * and there is no waiting data, this calls write_to_temp() in
	 * order to reduce a extra memory copy.
	 */
	if (wb_remaining(a) == wb_buffmax() && s > (1024 * 16)) {
		struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
		xs = s % LOGICAL_BLOCK_SIZE;
		iso9660->wbuff_offset += s - xs;
		if (write_to_temp(a, buff, s - xs) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if (xs == 0)
			return (ARCHIVE_OK);
		xp += s - xs;
	}

	while (xs) {
		size_t size = xs;
		if (size > wb_remaining(a))
			size = wb_remaining(a);
		memcpy(wb_buffptr(a), xp, size);
		if (wb_consume(a, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xs -= size;
		xp += size;
	}
	return (ARCHIVE_OK);
}